

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O0

int __thiscall TPZInterpolatedElement::NShapeF(TPZInterpolatedElement *this)

{
  int iVar1;
  uint uVar2;
  TPZConnect *this_00;
  long *in_RDI;
  TPZConnect *c;
  int res;
  int in;
  int nn;
  undefined4 local_14;
  undefined4 local_10;
  
  iVar1 = (**(code **)(*in_RDI + 0x90))();
  local_14 = 0;
  for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_10);
    uVar2 = TPZConnect::NShape(this_00);
    local_14 = uVar2 + local_14;
  }
  return local_14;
}

Assistant:

int TPZInterpolatedElement::NShapeF() const {
    int nn = NConnects();
    int in, res = 0;
    for (in = 0; in < nn; in++) {
        TPZConnect &c = Connect(in);
        res += c.NShape();
    }
    return res;
}